

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O0

TPZFMatrix<long_double> * __thiscall
TPZFMatrix<long_double>::operator*(TPZFMatrix<long_double> *this,TPZFMatrix<long_double> *A)

{
  int64_t iVar1;
  int64_t iVar2;
  TPZFMatrix<long_double> *this_00;
  TPZBaseMatrix *in_RDX;
  TPZBaseMatrix *in_RSI;
  TPZFMatrix<long_double> *in_RDI;
  undefined8 in_R9;
  TPZFMatrix<long_double> *res;
  char *in_stack_00000138;
  char *in_stack_00000140;
  int64_t in_stack_ffffffffffffff98;
  TPZFMatrix<long_double> *this_01;
  
  this_01 = in_RDI;
  iVar1 = TPZBaseMatrix::Cols(in_RSI);
  iVar2 = TPZBaseMatrix::Rows(in_RDX);
  if (iVar1 != iVar2) {
    Error(in_stack_00000140,in_stack_00000138);
  }
  TPZFMatrix(this_01);
  this_00 = (TPZFMatrix<long_double> *)TPZBaseMatrix::Rows(in_RSI);
  iVar1 = TPZBaseMatrix::Cols(in_RDX);
  Redim(this_00,iVar1,in_stack_ffffffffffffff98);
  (*(in_RSI->super_TPZSavable)._vptr_TPZSavable[0x27])
            (in_RSI,in_RDX,in_RDX,this_01,0,in_R9,(longdouble)1,(longdouble)0);
  return in_RDI;
}

Assistant:

inline TPZFMatrix<TVar> TPZFMatrix<TVar>::operator*(const TPZFMatrix<TVar> &A) const {
    if ( this->Cols() != A.Rows() )
        Error( "Operator* <matrixs with incompatible dimensions>" );
    
    TPZFMatrix<TVar> res;
    res.Redim( this->Rows(), A.Cols() );
    MultAdd(A,A,res,1.,0.,0);
    return( res );
}